

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

void __thiscall internalJSONNode::internalJSONNode(internalJSONNode *this,internalJSONNode *orig)

{
  bool bVar1;
  json_index_t amount;
  jsonChildren *pjVar2;
  JSONNode *item;
  JSONNode local_40;
  JSONNode **local_38;
  JSONNode **myrunner_end;
  JSONNode **myrunner;
  internalJSONNode *local_18;
  internalJSONNode *orig_local;
  internalJSONNode *this_local;
  
  this->_type = orig->_type;
  local_18 = orig;
  orig_local = this;
  std::__cxx11::string::string((string *)&this->_name,(string *)&orig->_name);
  this->_name_encoded = (bool)(local_18->_name_encoded & 1);
  std::__cxx11::string::string((string *)&this->_string,(string *)&local_18->_string);
  this->_string_encoded = (bool)(local_18->_string_encoded & 1);
  this->_value = local_18->_value;
  this->refcount = 1;
  this->fetched = (bool)(local_18->fetched & 1);
  this->Children = (jsonChildren *)0x0;
  bVar1 = isContainer(this);
  if (bVar1) {
    pjVar2 = jsonChildren::newChildren();
    this->Children = pjVar2;
    bVar1 = jsonChildren::empty(local_18->Children);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      pjVar2 = this->Children;
      amount = jsonChildren::size(local_18->Children);
      jsonChildren::reserve(pjVar2,amount);
      myrunner_end = jsonChildren::begin(local_18->Children);
      local_38 = jsonChildren::end(local_18->Children);
      for (; myrunner_end != local_38; myrunner_end = myrunner_end + 1) {
        pjVar2 = this->Children;
        ::JSONNode::duplicate(&local_40);
        item = ::JSONNode::newJSONNode(&local_40);
        jsonChildren::push_back(pjVar2,item);
        ::JSONNode::~JSONNode(&local_40);
      }
    }
  }
  return;
}

Assistant:

internalJSONNode::internalJSONNode(const internalJSONNode & orig) json_nothrow :
    _type(orig._type), _name(orig._name), _name_encoded(orig._name_encoded),
    _string(orig._string), _string_encoded(orig._string_encoded), _value(orig._value)
    initializeMutex(0)
    initializeRefCount(1)
    initializeFetch(orig.fetched)
    initializeComment(orig._comment)
    initializeChildren(0){


    LIBJSON_COPY_CTOR;
    if (isContainer()){
	   CHILDREN = jsonChildren::newChildren();
	   if (json_likely(!orig.CHILDREN -> empty())){
		  CHILDREN -> reserve(orig.CHILDREN -> size());
		  json_foreach(orig.CHILDREN, myrunner){
			 CHILDREN -> push_back(JSONNode::newJSONNode((*myrunner) -> duplicate()));
		  }
	   }
    }
    #ifdef JSON_MUTEX_CALLBACKS /*-> JSON_MUTEX_CALLBACKS */
	   _set_mutex(orig.mylock, false);
    #endif /*<- */
}